

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

gdImagePtr gdImageClone(gdImagePtr src)

{
  gdImagePtr pgVar1;
  int local_28;
  int local_24;
  int x;
  int i;
  gdImagePtr dst;
  gdImagePtr src_local;
  
  if (src->trueColor == 0) {
    _x = gdImageCreate(src->sx,src->sy);
  }
  else {
    _x = gdImageCreateTrueColor(src->sx,src->sy);
  }
  if (_x == (gdImagePtr)0x0) {
    src_local = (gdImagePtr)0x0;
  }
  else {
    if (src->trueColor == 0) {
      _x->colorsTotal = src->colorsTotal;
      for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
        _x->red[local_24] = src->red[local_24];
        _x->green[local_24] = src->green[local_24];
        _x->blue[local_24] = src->blue[local_24];
        _x->alpha[local_24] = src->alpha[local_24];
        _x->open[local_24] = src->open[local_24];
      }
      for (local_24 = 0; local_24 < src->sy; local_24 = local_24 + 1) {
        for (local_28 = 0; local_28 < src->sx; local_28 = local_28 + 1) {
          _x->pixels[local_24][local_28] = _x->pixels[local_24][local_28];
        }
      }
    }
    else {
      for (local_24 = 0; local_24 < src->sy; local_24 = local_24 + 1) {
        for (local_28 = 0; local_28 < src->sx; local_28 = local_28 + 1) {
          _x->tpixels[local_24][local_28] = src->tpixels[local_24][local_28];
        }
      }
    }
    if (0 < src->styleLength) {
      _x->styleLength = src->styleLength;
      _x->stylePos = src->stylePos;
      for (local_24 = 0; local_24 < src->styleLength; local_24 = local_24 + 1) {
        _x->style[local_24] = src->style[local_24];
      }
    }
    _x->interlace = src->interlace;
    _x->alphaBlendingFlag = src->alphaBlendingFlag;
    _x->saveAlphaFlag = src->saveAlphaFlag;
    _x->AA = src->AA;
    _x->AA_color = src->AA_color;
    _x->AA_dont_blend = src->AA_dont_blend;
    _x->cx1 = src->cx1;
    _x->cy1 = src->cy1;
    _x->cx2 = src->cx2;
    _x->cy2 = src->cy2;
    _x->res_x = src->res_x;
    _x->res_y = src->res_x;
    _x->paletteQuantizationMethod = src->paletteQuantizationMethod;
    _x->paletteQuantizationSpeed = src->paletteQuantizationSpeed;
    _x->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
    _x->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
    _x->interpolation_id = src->interpolation_id;
    _x->interpolation = src->interpolation;
    if (src->brush != (gdImageStruct *)0x0) {
      pgVar1 = gdImageClone(src->brush);
      _x->brush = pgVar1;
    }
    if (src->tile != (gdImageStruct *)0x0) {
      pgVar1 = gdImageClone(src->tile);
      _x->tile = pgVar1;
    }
    if (src->style != (int *)0x0) {
      gdImageSetStyle(_x,src->style,src->styleLength);
    }
    for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
      _x->brushColorMap[local_24] = src->brushColorMap[local_24];
      _x->tileColorMap[local_24] = src->tileColorMap[local_24];
    }
    if (0 < src->polyAllocated) {
      _x->polyAllocated = src->polyAllocated;
      for (local_24 = 0; local_24 < src->polyAllocated; local_24 = local_24 + 1) {
        _x->polyInts[local_24] = src->polyInts[local_24];
      }
    }
    src_local = _x;
  }
  return src_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageClone (gdImagePtr src) {
	gdImagePtr dst;
	register int i, x;

	if (src->trueColor) {
		dst = gdImageCreateTrueColor(src->sx , src->sy);
	} else {
		dst = gdImageCreate(src->sx , src->sy);
	}

	if (dst == NULL) {
		return NULL;
	}

	if (src->trueColor == 0) {
		dst->colorsTotal = src->colorsTotal;
		for (i = 0; i < gdMaxColors; i++) {
			dst->red[i]   = src->red[i];
			dst->green[i] = src->green[i];
			dst->blue[i]  = src->blue[i];
			dst->alpha[i] = src->alpha[i];
			dst->open[i]  = src->open[i];
		}
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->pixels[i][x] = dst->pixels[i][x];
			}
		}
	} else {
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->tpixels[i][x] = src->tpixels[i][x];
			}
		}
	}

	if (src->styleLength > 0) {
		dst->styleLength = src->styleLength;
		dst->stylePos    = src->stylePos;
		for (i = 0; i < src->styleLength; i++) {
			dst->style[i] = src->style[i];
		}
	}

	dst->interlace   = src->interlace;

	dst->alphaBlendingFlag = src->alphaBlendingFlag;
	dst->saveAlphaFlag     = src->saveAlphaFlag;
	dst->AA                = src->AA;
	dst->AA_color          = src->AA_color;
	dst->AA_dont_blend     = src->AA_dont_blend;

	dst->cx1 = src->cx1;
	dst->cy1 = src->cy1;
	dst->cx2 = src->cx2;
	dst->cy2 = src->cy2;

	dst->res_x = src->res_x;
	dst->res_y = src->res_x;

	dst->paletteQuantizationMethod     = src->paletteQuantizationMethod;
	dst->paletteQuantizationSpeed      = src->paletteQuantizationSpeed;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;

	dst->interpolation_id = src->interpolation_id;
	dst->interpolation    = src->interpolation;

	if (src->brush) {
		dst->brush = gdImageClone(src->brush);
	}

	if (src->tile) {
		dst->tile = gdImageClone(src->tile);
	}

	if (src->style) {
		gdImageSetStyle(dst, src->style, src->styleLength);
	}

	for (i = 0; i < gdMaxColors; i++) {
		dst->brushColorMap[i] = src->brushColorMap[i];
		dst->tileColorMap[i] = src->tileColorMap[i];
	}

	if (src->polyAllocated > 0) {
		dst->polyAllocated = src->polyAllocated;
		for (i = 0; i < src->polyAllocated; i++) {
			dst->polyInts[i] = src->polyInts[i];
		}
	}

	return dst;
}